

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitContBind
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ContBind *curr,
          optional<wasm::HeapType> src,optional<wasm::HeapType> dest)

{
  bool bVar1;
  HeapType *pHVar2;
  size_t sVar3;
  size_t sVar4;
  Expression **ppEVar5;
  Type *pTVar6;
  Signature SVar7;
  Type local_a8;
  uintptr_t local_a0;
  size_t local_98;
  size_t i;
  size_t n;
  Signature local_80;
  Type local_70;
  Type targetParams;
  Type local_60;
  Type local_50;
  Type sourceParams;
  HeapType local_40;
  ContBind *local_38;
  ContBind *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<wasm::HeapType> dest_local;
  optional<wasm::HeapType> src_local;
  
  dest_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ =
       src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_payload;
  this_local = dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
  dest_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  local_38 = curr;
  curr_local = (ContBind *)this;
  bVar1 = std::optional<wasm::HeapType>::has_value
                    ((optional<wasm::HeapType> *)
                     &dest_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._M_engaged);
  if (!bVar1) {
    local_40 = wasm::Type::getHeapType(&local_38->cont->type);
    std::optional<wasm::HeapType>::operator=
              ((optional<wasm::HeapType> *)
               &dest_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged,&local_40);
  }
  bVar1 = std::optional<wasm::HeapType>::has_value((optional<wasm::HeapType> *)&this_local);
  if (!bVar1) {
    sourceParams.id =
         (uintptr_t)
         wasm::Type::getHeapType
                   (&(local_38->super_SpecificExpression<(wasm::Expression::Id)91>).super_Expression
                     .type);
    std::optional<wasm::HeapType>::operator=
              ((optional<wasm::HeapType> *)&this_local,(HeapType *)&sourceParams);
  }
  pHVar2 = std::optional<wasm::HeapType>::operator->
                     ((optional<wasm::HeapType> *)
                      &dest_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_engaged);
  targetParams.id = (uintptr_t)HeapType::getContinuation(pHVar2);
  SVar7 = HeapType::getSignature((HeapType *)&targetParams);
  local_60 = SVar7.params.id;
  local_50.id = local_60.id;
  pHVar2 = std::optional<wasm::HeapType>::operator->((optional<wasm::HeapType> *)&this_local);
  n = (size_t)HeapType::getContinuation(pHVar2);
  local_80 = HeapType::getSignature((HeapType *)&n);
  local_70.id = local_80.params.id;
  sVar3 = wasm::Type::size(&local_50);
  sVar4 = wasm::Type::size(&local_70);
  if (sVar4 <= sVar3) {
    sVar3 = wasm::Type::size(&local_50);
    sVar4 = wasm::Type::size(&local_70);
    i = sVar3 - sVar4;
    sVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                      (&(local_38->operands).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    if (sVar3 == i) {
      for (local_98 = 0; local_98 < i; local_98 = local_98 + 1) {
        ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(local_38->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,local_98);
        pTVar6 = wasm::Type::operator[](&local_50,local_98);
        local_a0 = pTVar6->id;
        note(this,ppEVar5,(Type)local_a0);
      }
      ppEVar5 = &local_38->cont;
      pHVar2 = std::optional<wasm::HeapType>::operator*
                         ((optional<wasm::HeapType> *)
                          &dest_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                           super__Optional_payload_base<wasm::HeapType>._M_engaged);
      wasm::Type::Type(&local_a8,(HeapType)pHVar2->id,Nullable,Inexact);
      note(this,ppEVar5,local_a8);
      return;
    }
    __assert_fail("curr->operands.size() == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                  ,0x45b,
                  "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitContBind(ContBind *, std::optional<HeapType>, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
                 );
  }
  __assert_fail("sourceParams.size() >= targetParams.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                ,0x459,
                "void wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitContBind(ContBind *, std::optional<HeapType>, std::optional<HeapType>) [Subtype = wasm::IRBuilder::ChildPopper::ConstraintCollector]"
               );
}

Assistant:

void visitContBind(ContBind* curr,
                     std::optional<HeapType> src = std::nullopt,
                     std::optional<HeapType> dest = std::nullopt) {
    if (!src.has_value()) {
      src = curr->cont->type.getHeapType();
    }
    if (!dest.has_value()) {
      dest = curr->type.getHeapType();
    }
    auto sourceParams = src->getContinuation().type.getSignature().params;
    auto targetParams = dest->getContinuation().type.getSignature().params;
    assert(sourceParams.size() >= targetParams.size());
    auto n = sourceParams.size() - targetParams.size();
    assert(curr->operands.size() == n);
    for (size_t i = 0; i < n; ++i) {
      note(&curr->operands[i], sourceParams[i]);
    }
    note(&curr->cont, Type(*src, Nullable));
  }